

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SubDEdgePtr *unsorted_edges,uint unsorted_edge_count,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  int iVar1;
  uint uVar2;
  ON_SubDEdgePtr *pOVar3;
  undefined1 local_40 [8];
  ON_SimpleArray<ON_SubDEdgePtr> local_unsorted_edges;
  uint chain_count;
  ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges_local;
  uint unsorted_edge_count_local;
  ON_SubDEdgePtr *unsorted_edges_local;
  
  local_unsorted_edges.m_capacity = 0;
  if (((unsorted_edges != (ON_SubDEdgePtr *)0x0) && (unsorted_edge_count != 0)) &&
     (unsorted_edge_count != 0xffffffff)) {
    iVar1 = ON_SimpleArray<ON_SubDEdgePtr>::Capacity(sorted_edges);
    if ((0 < iVar1) &&
       (pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::Array(sorted_edges), pOVar3 <= unsorted_edges)) {
      pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::Array(sorted_edges);
      iVar1 = ON_SimpleArray<ON_SubDEdgePtr>::Capacity(sorted_edges);
      if (unsorted_edges < pOVar3 + iVar1) {
        ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_40);
        ON_SimpleArray<ON_SubDEdgePtr>::Append
                  ((ON_SimpleArray<ON_SubDEdgePtr> *)local_40,unsorted_edge_count,unsorted_edges);
        pOVar3 = ON_SimpleArray<ON_SubDEdgePtr>::Array((ON_SimpleArray<ON_SubDEdgePtr> *)local_40);
        uVar2 = ON_SimpleArray<ON_SubDEdgePtr>::UnsignedCount
                          ((ON_SimpleArray<ON_SubDEdgePtr> *)local_40);
        local_unsorted_edges.m_capacity =
             Internal_MuchImprovedSortEdgesIntoChains(&pOVar3->m_ptr,(ulong)uVar2,sorted_edges);
        ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray((ON_SimpleArray<ON_SubDEdgePtr> *)local_40);
        return local_unsorted_edges.m_capacity;
      }
    }
    local_unsorted_edges.m_capacity =
         Internal_MuchImprovedSortEdgesIntoChains
                   (&unsorted_edges->m_ptr,(ulong)unsorted_edge_count,sorted_edges);
  }
  return local_unsorted_edges.m_capacity;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SubDEdgePtr* unsorted_edges,
  unsigned unsorted_edge_count,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  unsigned int chain_count = 0;
  if (nullptr != unsorted_edges && unsorted_edge_count > 0 && unsorted_edge_count < ON_UNSET_UINT_INDEX)
  {
    if (sorted_edges.Capacity() > 0 && unsorted_edges >= sorted_edges.Array() && unsorted_edges < sorted_edges.Array() + sorted_edges.Capacity())
    {
      ON_SimpleArray< ON_SubDEdgePtr > local_unsorted_edges;
      local_unsorted_edges.Append(unsorted_edge_count, unsorted_edges);
      chain_count = Internal_MuchImprovedSortEdgesIntoChains(
        (const ON__UINT_PTR*)local_unsorted_edges.Array(),
        local_unsorted_edges.UnsignedCount(),
        sorted_edges
      );
    }
    else
    {
      chain_count = Internal_MuchImprovedSortEdgesIntoChains(
        (const ON__UINT_PTR*)unsorted_edges,
        unsorted_edge_count,
        sorted_edges
      );
    }
  }
  return chain_count;
}